

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-server.c
# Opt level: O1

void free_auth_kbdint(AuthKbdInt *aki)

{
  long lVar1;
  long lVar2;
  
  if (aki != (AuthKbdInt *)0x0) {
    safefree(aki->title);
    safefree(aki->instruction);
    if (0 < aki->nprompts) {
      lVar1 = 0;
      lVar2 = 0;
      do {
        safefree(*(void **)((long)&aki->prompts->prompt + lVar1));
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (lVar2 < aki->nprompts);
    }
    safefree(aki->prompts);
    safefree(aki);
    return;
  }
  return;
}

Assistant:

static void free_auth_kbdint(AuthKbdInt *aki)
{
    int i;

    if (!aki)
        return;

    sfree(aki->title);
    sfree(aki->instruction);
    for (i = 0; i < aki->nprompts; i++)
        sfree(aki->prompts[i].prompt);
    sfree(aki->prompts);
    sfree(aki);
}